

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::Decode
          (FundamentalOperationalData *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    KDataStream::Read(stream,(KUOCTET *)&this->field_0);
    KDataStream::Read(stream,&(this->field_0).field_0.m_ui8AltParam4);
    KDataStream::Read(stream,&(this->field_0).field_0.m_ui8InfoLayers);
    KDataStream::Read(stream,&(this->field_0).field_0.m_ui8Modifier);
    KDataStream::Read<unsigned_short>(stream,&(this->field_0).field_0.m_ui16Param1);
    KDataStream::Read<unsigned_short>(stream,&(this->field_0).field_0.m_ui16Param2);
    KDataStream::Read<unsigned_short>(stream,&(this->field_0).field_0.m_ui16Param3);
    KDataStream::Read<unsigned_short>(stream,&(this->field_0).field_0.m_ui16Param4);
    KDataStream::Read<unsigned_short>(stream,&(this->field_0).field_0.m_ui16Param5);
    KDataStream::Read<unsigned_short>(stream,&(this->field_0).field_0.m_ui16Param6);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void FundamentalOperationalData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < FUNDAMENTAL_OPERATIONAL_DATA_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8SystemStatus
           >> m_ui8AltParam4
           >> m_ui8InfoLayers
           >> m_ui8Modifier
           >> m_ui16Param1
           >> m_ui16Param2
           >> m_ui16Param3
           >> m_ui16Param4
           >> m_ui16Param5
           >> m_ui16Param6;
}